

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RGBColorTableRow_C(uint8_t *dst_argb,uint8_t *table_argb,int width)

{
  int r;
  int g;
  int b;
  int x;
  int width_local;
  uint8_t *table_argb_local;
  uint8_t *dst_argb_local;
  
  dst_argb_local = dst_argb;
  for (x = 0; x < width; x = x + 1) {
    *dst_argb_local = table_argb[(int)((uint)*dst_argb_local << 2)];
    dst_argb_local[1] = table_argb[(int)((uint)dst_argb_local[1] * 4 + 1)];
    dst_argb_local[2] = table_argb[(int)((uint)dst_argb_local[2] * 4 + 2)];
    dst_argb_local = dst_argb_local + 4;
  }
  return;
}

Assistant:

void RGBColorTableRow_C(uint8_t* dst_argb,
                        const uint8_t* table_argb,
                        int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = dst_argb[0];
    int g = dst_argb[1];
    int r = dst_argb[2];
    dst_argb[0] = table_argb[b * 4 + 0];
    dst_argb[1] = table_argb[g * 4 + 1];
    dst_argb[2] = table_argb[r * 4 + 2];
    dst_argb += 4;
  }
}